

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

Fraig_Node_t * Abc_NtkToFraigExdc(Fraig_Man_t *pMan,Abc_Ntk_t *pNtkMain,Abc_Ntk_t *pNtkExdc)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  Fraig_Node_t *pFVar5;
  Abc_Obj_t *pAVar6;
  char **__ptr;
  char *__s1;
  Abc_Obj_t *pAVar7;
  int local_48;
  int local_44;
  int k;
  int i;
  char **ppNames;
  Fraig_Node_t *gResult;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkStrash;
  Abc_Ntk_t *pNtkExdc_local;
  Abc_Ntk_t *pNtkMain_local;
  Fraig_Man_t *pMan_local;
  
  pNtk = Abc_NtkStrash(pNtkExdc,0,0,0);
  Abc_NtkCleanCopy(pNtk);
  pFVar5 = Fraig_ManReadConst1(pMan);
  pAVar6 = Abc_AigConst1(pNtk);
  (pAVar6->field_6).pCopy = (Abc_Obj_t *)pFVar5;
  __ptr = Abc_NtkCollectCioNames(pNtkMain,0);
  local_44 = 0;
  do {
    iVar3 = Abc_NtkCiNum(pNtk);
    if (iVar3 <= local_44) {
      if (__ptr != (char **)0x0) {
        free(__ptr);
      }
      for (local_44 = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar3; local_44 = local_44 + 1
          ) {
        pAVar6 = Abc_NtkObj(pNtk,local_44);
        if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_AigNodeIsAnd(pAVar6), iVar3 != 0)) {
          pAVar7 = Abc_ObjFanin0(pAVar6);
          pvVar2 = (pAVar7->field_6).pTemp;
          iVar3 = Abc_ObjFaninC0(pAVar6);
          pAVar7 = Abc_ObjFanin1(pAVar6);
          pvVar1 = (pAVar7->field_6).pTemp;
          iVar4 = Abc_ObjFaninC1(pAVar6);
          pFVar5 = Fraig_NodeAnd(pMan,(Fraig_Node_t *)((ulong)pvVar2 ^ (long)iVar3),
                                 (Fraig_Node_t *)((ulong)pvVar1 ^ (long)iVar4));
          (pAVar6->field_6).pCopy = (Abc_Obj_t *)pFVar5;
        }
      }
      pAVar6 = Abc_NtkPo(pNtk,0);
      pAVar7 = Abc_ObjFanin0(pAVar6);
      pvVar2 = (pAVar7->field_6).pTemp;
      iVar3 = Abc_ObjFaninC0(pAVar6);
      Abc_NtkDelete(pNtk);
      return (Fraig_Node_t *)((ulong)pvVar2 ^ (long)iVar3);
    }
    pAVar6 = Abc_NtkCi(pNtk,local_44);
    for (local_48 = 0; iVar3 = Abc_NtkCiNum(pNtkMain), local_48 < iVar3; local_48 = local_48 + 1) {
      __s1 = Abc_ObjName(pAVar6);
      iVar3 = strcmp(__s1,__ptr[local_48]);
      if (iVar3 == 0) {
        pFVar5 = Fraig_ManReadIthVar(pMan,local_48);
        (pAVar6->field_6).pCopy = (Abc_Obj_t *)pFVar5;
        break;
      }
    }
    if ((pAVar6->field_6).pTemp == (void *)0x0) {
      __assert_fail("pObj->pCopy != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                    ,0xb9,
                    "Fraig_Node_t *Abc_NtkToFraigExdc(Fraig_Man_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

Fraig_Node_t * Abc_NtkToFraigExdc( Fraig_Man_t * pMan, Abc_Ntk_t * pNtkMain, Abc_Ntk_t * pNtkExdc )
{
    Abc_Ntk_t * pNtkStrash;
    Abc_Obj_t * pObj;
    Fraig_Node_t * gResult;
    char ** ppNames;
    int i, k;
    // strash the EXDC network
    pNtkStrash = Abc_NtkStrash( pNtkExdc, 0, 0, 0 );
    Abc_NtkCleanCopy( pNtkStrash );
    Abc_AigConst1(pNtkStrash)->pCopy = (Abc_Obj_t *)Fraig_ManReadConst1(pMan);
    // set the mapping of the PI nodes
    ppNames = Abc_NtkCollectCioNames( pNtkMain, 0 );
    Abc_NtkForEachCi( pNtkStrash, pObj, i )
    {
        for ( k = 0; k < Abc_NtkCiNum(pNtkMain); k++ )
            if ( strcmp( Abc_ObjName(pObj), ppNames[k] ) == 0 )
            {
                pObj->pCopy = (Abc_Obj_t *)Fraig_ManReadIthVar(pMan, k);
                break;
            }
        assert( pObj->pCopy != NULL );
    }
    ABC_FREE( ppNames );
    // build FRAIG for each node
    Abc_AigForEachAnd( pNtkStrash, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Fraig_NodeAnd( pMan, 
                Fraig_NotCond( Abc_ObjFanin0(pObj)->pCopy, (int)Abc_ObjFaninC0(pObj) ),
                Fraig_NotCond( Abc_ObjFanin1(pObj)->pCopy, (int)Abc_ObjFaninC1(pObj) ) );
    // get the EXDC to be returned
    pObj = Abc_NtkPo( pNtkStrash, 0 );
    gResult = Fraig_NotCond( Abc_ObjFanin0(pObj)->pCopy, (int)Abc_ObjFaninC0(pObj) );
    Abc_NtkDelete( pNtkStrash );
    return gResult;
}